

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::correctOutput(HlslParseContext *this,TQualifier *qualifier)

{
  ulong uVar1;
  ulong uVar2;
  TIntermediate *pTVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  EShLanguage EVar8;
  
  uVar1 = *(ulong *)&qualifier->field_0x8;
  uVar2 = *(ulong *)&qualifier->field_0x24;
  uVar6 = uVar1 & 0x1fffffffffffffff;
  *(ulong *)&qualifier->field_0x8 = uVar6;
  qualifier->field_0x10 = qualifier->field_0x10 & 0xf0;
  qualifier->layoutOffset = -1;
  qualifier->layoutAlign = -1;
  uVar7 = *(ulong *)&qualifier->field_0x1c & 0xffff0000ffc07fff;
  *(ulong *)&qualifier->field_0x1c = uVar7 | 0xffff001f8000;
  *(ulong *)&qualifier->field_0x24 = uVar2 | 0xff00000000;
  qualifier->layoutPushConstant = false;
  EVar8 = (this->super_TParseContextBase).super_TParseVersions.language;
  if (EVar8 == EShLangFragment) {
    uVar6 = uVar1 & 0x1fffc01f1fffffff;
    *(ulong *)&qualifier->field_0x8 = uVar6;
    EVar8 = (this->super_TParseContextBase).super_TParseVersions.language;
  }
  if (EVar8 == EShLangGeometry) {
LAB_003926c7:
    uVar6 = uVar6 & 0x1fffefffffffffff;
    *(ulong *)&qualifier->field_0x8 = uVar6;
  }
  else {
    *(ulong *)&qualifier->field_0x1c = uVar7 | 0xff00ffff001f8000;
    EVar8 = (this->super_TParseContextBase).super_TParseVersions.language;
    if (EVar8 == EShLangFragment) {
      *(ulong *)&qualifier->field_0x24 = uVar2 | 0xff7fffffff;
      EVar8 = (this->super_TParseContextBase).super_TParseVersions.language;
    }
    if (EVar8 != EShLangTessControl) goto LAB_003926c7;
  }
  if ((uVar6 & 0xff80) == 0) {
    uVar6 = uVar6 | (uint)(uVar6 >> 9) & 0xff80;
    *(ulong *)&qualifier->field_0x8 = uVar6;
  }
  uVar5 = (uint)(uVar6 >> 7) & 0x1ff;
  if (uVar5 == 0x92) {
    pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar3->depthReplacing = true;
    if (pTVar3->depthLayout == EldNone) {
      pTVar3->depthLayout = EldLess;
    }
  }
  else {
    if (uVar5 != 0x91) {
      if (uVar5 == 0x43) {
        pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar3->depthReplacing = true;
        if (pTVar3->depthLayout == EldNone) {
          pTVar3->depthLayout = EldAny;
        }
      }
      goto LAB_0039277f;
    }
    pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar3->depthReplacing = true;
    if (pTVar3->depthLayout == EldNone) {
      pTVar3->depthLayout = EldGreater;
    }
  }
  *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffff007f | 0x2180;
LAB_0039277f:
  bVar4 = isOutputBuiltIn(this,qualifier);
  if (!bVar4) {
    *(ushort *)&qualifier->field_0x8 = *(ushort *)&qualifier->field_0x8 & 0x7f;
  }
  return;
}

Assistant:

void HlslParseContext::correctOutput(TQualifier& qualifier)
{
    clearUniform(qualifier);
    if (language == EShLangFragment)
        qualifier.clearInterstage();
    if (language != EShLangGeometry)
        qualifier.clearStreamLayout();
    if (language == EShLangFragment)
        qualifier.clearXfbLayout();
    if (language != EShLangTessControl)
        qualifier.patch = false;

    // Fixes Test/hlsl.entry-inout.vert (SV_Position will not become a varying).
    if (qualifier.builtIn == EbvNone)
        qualifier.builtIn = qualifier.declaredBuiltIn;

    switch (qualifier.builtIn) {
    case EbvFragDepth:
        intermediate.setDepthReplacing();
        intermediate.setDepth(EldAny);
        break;
    case EbvFragDepthGreater:
        intermediate.setDepthReplacing();
        intermediate.setDepth(EldGreater);
        qualifier.builtIn = EbvFragDepth;
        break;
    case EbvFragDepthLesser:
        intermediate.setDepthReplacing();
        intermediate.setDepth(EldLess);
        qualifier.builtIn = EbvFragDepth;
        break;
    default:
        break;
    }

    if (! isOutputBuiltIn(qualifier))
        qualifier.builtIn = EbvNone;
}